

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O1

void chapter3::initialize_exclude_set
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *exclude_set)

{
  int iVar1;
  long lVar2;
  _Alloc_node __an;
  _Alloc_node local_30;
  
  if (initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
      ::exclude_words_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                                 ::exclude_words_abi_cxx11_);
    if (iVar1 != 0) {
      initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
      ::exclude_words_abi_cxx11_[0]._M_dataplus._M_p =
           (pointer)&initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                     ::exclude_words_abi_cxx11_[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                 ::exclude_words_abi_cxx11_,"a","");
      initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
      ::exclude_words_abi_cxx11_[1]._M_dataplus._M_p =
           (pointer)&initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                     ::exclude_words_abi_cxx11_[1].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                  ::exclude_words_abi_cxx11_ + 1),"an","");
      initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
      ::exclude_words_abi_cxx11_[2]._M_dataplus._M_p =
           (pointer)&initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                     ::exclude_words_abi_cxx11_[2].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                  ::exclude_words_abi_cxx11_ + 2),"or","");
      initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
      ::exclude_words_abi_cxx11_[3]._M_dataplus._M_p =
           (pointer)&initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                     ::exclude_words_abi_cxx11_[3].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                  ::exclude_words_abi_cxx11_ + 3),"the","");
      initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
      ::exclude_words_abi_cxx11_[4]._M_dataplus._M_p =
           (pointer)&initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                     ::exclude_words_abi_cxx11_[4].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                  ::exclude_words_abi_cxx11_ + 4),"and","");
      initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
      ::exclude_words_abi_cxx11_[5]._M_dataplus._M_p =
           (pointer)&initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                     ::exclude_words_abi_cxx11_[5].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                  ::exclude_words_abi_cxx11_ + 5),"but","");
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                           ::exclude_words_abi_cxx11_);
    }
  }
  lVar2 = 0;
  local_30._M_t = &exclude_set->_M_t;
  do {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::
    _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)exclude_set,(const_iterator)&(exclude_set->_M_t)._M_impl.super__Rb_tree_header,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                       ::exclude_words_abi_cxx11_[0]._M_dataplus._M_p + lVar2),&local_30);
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0xc0);
  return;
}

Assistant:

inline void chapter3::initialize_exclude_set(set<string> &exclude_set) {
    static string exclude_words[] = {
            "a", "an", "or", "the", "and", "but"
    };
    exclude_set.insert(exclude_words, exclude_words + sizeof(exclude_words) / sizeof(*exclude_words));
    // set<string> exclude_set(filter_str_array, filter_str_array + sizeof(filter_str_array) / sizeof(*filter_str_array));
    /*cout << sizeof(filter_str_array) << endl;
    cout << filter_str_array << endl;
    cout << sizeof(*filter_str_array) << endl;
    cout << *filter_str_array << endl;
    cout << sizeof(filter_str_array) / sizeof(*filter_str_array) << endl;
    cout << filter_sets.size() << endl;*/
}